

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O2

DEFBUF * lookid(Global *global,int c)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *obj;
  DEFBUF *pDVar4;
  int iVar5;
  ulong uVar6;
  DEFBUF *pDVar7;
  
  uVar1 = c;
  if (c == 0x1d) {
    uVar1 = get(global);
  }
  uVar6 = 0;
  iVar3 = 0;
  do {
    uVar2 = uVar1;
    iVar5 = iVar3;
    uVar1 = global->tokenbsize;
    obj = global->tokenbuf;
    if (uVar6 == uVar1) {
      global->tokenbsize = uVar1 * 2;
      obj = incmem(global,obj,uVar1 * 2 + 1);
      global->tokenbuf = obj;
    }
    obj[uVar6] = (char)uVar2;
    uVar6 = uVar6 + 1;
    uVar1 = get(global);
    iVar3 = iVar5 + uVar2;
  } while ((byte)(type[uVar1] - 1U) < 2);
  unget(global);
  iVar3 = 0;
  global->tokenbuf[uVar6 & 0xffffffff] = '\0';
  if (c == 0x1d) {
    pDVar4 = (DEFBUF *)0x0;
  }
  else {
    uVar6 = (iVar5 + uVar2) + uVar6;
    iVar5 = (int)uVar6;
    pDVar7 = (DEFBUF *)
             (global->symtab +
             (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) % 0x40));
    do {
      do {
        pDVar7 = pDVar7->link;
        if (pDVar7 == (DEFBUF *)0x0) goto LAB_00105af9;
      } while (pDVar7->hash != (long)iVar5);
      iVar3 = strcmp(pDVar7->name,global->tokenbuf);
    } while (iVar3 < 0);
LAB_00105af9:
    pDVar4 = (DEFBUF *)0x0;
    if (iVar3 == 0) {
      pDVar4 = pDVar7;
    }
  }
  return pDVar4;
}

Assistant:

DEFBUF *lookid(struct Global *global,
	       int c)		/* First character of token	*/
{
  /*
   * Look for the next token in the symbol table. Returns token in tokenbuf.
   * If found, returns the table pointer;  Else returns NULL.
   */

  int nhash;
  DEFBUF *dp;
  int ct;
  int temp;
  int isrecurse;	/* For #define foo foo	*/
  
  nhash = 0;
  temp = 0;
  if ((isrecurse = (c == DEF_MAGIC)))   /* If recursive macro   */
    c = get(global);                    /* hack, skip DEF_MAGIC */
  ct = 0;
  do {
    if (ct == global->tokenbsize)
      global->tokenbuf = incmem(global, global->tokenbuf, 1 + (global->tokenbsize *= 2));
    global->tokenbuf[ct++] = c; 	/* Store token byte	*/
    nhash += c; 			/* Update hash value	*/
    c = get(global);
  }  while (type[c] == LET || type[c] == DIG);
  unget(global);                        /* Rescan terminator    */
  global->tokenbuf[ct] = EOS;		/* Terminate token	*/
  if (isrecurse)                        /* Recursive definition */
    return(NULL);                       /* undefined just now   */
  nhash += ct;				/* Fix hash value	*/
  dp = global->symtab[nhash % SBSIZE];  /* Starting bucket	*/
  while (dp != (DEFBUF *) NULL) {       /* Search symbol table  */
    if (dp->hash == nhash               /* Fast precheck        */
	&& (temp = strcmp(dp->name, global->tokenbuf)) >= 0)
      break;
    dp = dp->link;			/* Nope, try next one	*/
  }
  return((temp == 0) ? dp : NULL);
}